

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              size_t ilen,uchar *input,uchar *output)

{
  int iVar1;
  uchar *puVar2;
  ulong in_RCX;
  uchar *input_00;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  void *in_R8;
  mbedtls_rsa_context *in_R9;
  bool bVar3;
  int rng_dl;
  uchar *p;
  int ret;
  size_t olen;
  size_t nb_pad;
  int local_5c;
  char *local_58;
  uchar *output_00;
  int local_4;
  
  output_00 = *(uchar **)(in_RDI + 8);
  if ((in_RCX + 0xb < in_RCX) || (output_00 < (uchar *)(in_RCX + 0xb))) {
    local_4 = -0x4080;
  }
  else {
    puVar2 = output_00 + (-3 - in_RCX);
    *(undefined1 *)&in_R9->ver = 0;
    if (in_RSI == (code *)0x0) {
      local_4 = -0x4080;
    }
    else {
      local_58 = (char *)((long)&in_R9->ver + 2);
      *(undefined1 *)((long)&in_R9->ver + 1) = 2;
      while (input_00 = puVar2 + -1, puVar2 != (uchar *)0x0) {
        local_5c = 100;
        puVar2 = input_00;
        do {
          iVar1 = (*in_RSI)(in_RDX,local_58,1);
          bVar3 = false;
          if (*local_58 == '\0') {
            local_5c = local_5c + -1;
            bVar3 = false;
            if (local_5c != 0) {
              bVar3 = iVar1 == 0;
            }
          }
        } while (bVar3);
        if ((local_5c == 0) || (iVar1 != 0)) {
          iVar1 = mbedtls_error_add(-0x4480,iVar1,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                    ,0x74d);
          return iVar1;
        }
        local_58 = local_58 + 1;
      }
      *local_58 = '\0';
      if (in_RCX != 0) {
        memcpy(local_58 + 1,in_R8,in_RCX);
      }
      local_4 = mbedtls_rsa_public(in_R9,input_00,output_00);
    }
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt(mbedtls_rsa_context *ctx,
                                        int (*f_rng)(void *, unsigned char *, size_t),
                                        void *p_rng, size_t ilen,
                                        const unsigned char *input,
                                        unsigned char *output)
{
    size_t nb_pad, olen;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = output;

    olen = ctx->len;

    /* first comparison checks for overflow */
    if (ilen + 11 < ilen || olen < ilen + 11) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    nb_pad = olen - 3 - ilen;

    *p++ = 0;

    if (f_rng == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    *p++ = MBEDTLS_RSA_CRYPT;

    while (nb_pad-- > 0) {
        int rng_dl = 100;

        do {
            ret = f_rng(p_rng, p, 1);
        } while (*p == 0 && --rng_dl && ret == 0);

        /* Check if RNG failed to generate data */
        if (rng_dl == 0 || ret != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_RNG_FAILED, ret);
        }

        p++;
    }

    *p++ = 0;
    if (ilen != 0) {
        memcpy(p, input, ilen);
    }

    return mbedtls_rsa_public(ctx, output, output);
}